

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O2

ir_function_signature * __thiscall
anon_unknown.dwarf_dde02::builtin_builder::_textureCubeArrayShadow
          (builtin_builder *this,ir_texture_opcode opcode,builtin_available_predicate avail,
          glsl_type *sampler_type)

{
  exec_node *peVar1;
  void *mem_ctx;
  ir_variable *piVar2;
  ir_variable *this_00;
  ir_variable *this_01;
  ir_function_signature *piVar3;
  operand retval;
  ir_dereference_variable *piVar4;
  glsl_type *pgVar5;
  ir_return *ir;
  exec_node *peVar6;
  char *name;
  undefined4 in_register_00000034;
  ir_variable *var;
  glsl_type *var_00;
  ir_texture_opcode op;
  ir_factory body;
  
  op = (ir_texture_opcode)this;
  piVar2 = in_var(&builtins,(glsl_type *)avail,"sampler");
  this_00 = in_var(&builtins,&glsl_type::_vec4_type,"P");
  var_00 = &glsl_type::_float_type;
  this_01 = in_var(&builtins,&glsl_type::_float_type,"compare");
  piVar3 = new_sig(&builtins,&glsl_type::_float_type,
                   (builtin_available_predicate)CONCAT44(in_register_00000034,opcode),3,piVar2,
                   this_00,this_01);
  mem_ctx = builtins.mem_ctx;
  body.instructions = &piVar3->body;
  body.mem_ctx = builtins.mem_ctx;
  piVar3->field_0x48 = piVar3->field_0x48 | 1;
  retval.val = (ir_rvalue *)exec_node::operator_new(0x68,mem_ctx);
  var = (ir_variable *)((ulong)this & 0xffffffff);
  ir_texture::ir_texture((ir_texture *)retval.val,op);
  piVar2 = (ir_variable *)var_ref((builtin_builder *)piVar2,var);
  ir_texture::set_sampler((ir_texture *)retval.val,(ir_dereference *)piVar2,&glsl_type::_float_type)
  ;
  piVar4 = var_ref((builtin_builder *)this_00,piVar2);
  retval.val[1].super_ir_instruction.super_exec_node.prev = (exec_node *)piVar4;
  pgVar5 = (glsl_type *)var_ref((builtin_builder *)this_01,piVar2);
  retval.val[1].type = pgVar5;
  if (op == ir_txb) {
    name = "bias";
  }
  else {
    if (op != ir_txl) goto LAB_001b852d;
    name = "lod";
  }
  piVar2 = in_var(&builtins,&glsl_type::_float_type,name);
  peVar6 = &(piVar2->super_ir_instruction).super_exec_node;
  if (piVar2 == (ir_variable *)0x0) {
    peVar6 = (exec_node *)0x0;
  }
  peVar6->next = &(piVar3->parameters).tail_sentinel;
  peVar1 = (piVar3->parameters).tail_sentinel.prev;
  peVar6->prev = peVar1;
  peVar1->next = peVar6;
  (piVar3->parameters).tail_sentinel.prev = peVar6;
  piVar4 = var_ref((builtin_builder *)piVar2,(ir_variable *)var_00);
  retval.val[2].super_ir_instruction.super_exec_node.next = (exec_node *)piVar4;
LAB_001b852d:
  ir = ir_builder::ret(retval);
  ir_builder::ir_factory::emit(&body,(ir_instruction *)ir);
  return piVar3;
}

Assistant:

ir_function_signature *
builtin_builder::_textureCubeArrayShadow(ir_texture_opcode opcode,
                                         builtin_available_predicate avail,
                                         const glsl_type *sampler_type)
{
   ir_variable *s = in_var(sampler_type, "sampler");
   ir_variable *P = in_var(glsl_type::vec4_type, "P");
   ir_variable *compare = in_var(glsl_type::float_type, "compare");
   MAKE_SIG(glsl_type::float_type, avail, 3, s, P, compare);

   ir_texture *tex = new(mem_ctx) ir_texture(opcode);
   tex->set_sampler(var_ref(s), glsl_type::float_type);

   tex->coordinate = var_ref(P);
   tex->shadow_comparator = var_ref(compare);

   if (opcode == ir_txb) {
      ir_variable *bias = in_var(glsl_type::float_type, "bias");
      sig->parameters.push_tail(bias);
      tex->lod_info.bias = var_ref(bias);
   }

   if (opcode == ir_txl) {
      ir_variable *lod = in_var(glsl_type::float_type, "lod");
      sig->parameters.push_tail(lod);
      tex->lod_info.lod = var_ref(lod);
   }

   body.emit(ret(tex));

   return sig;
}